

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.cpp
# Opt level: O0

RenderPassDesc *
Diligent::GetImplicitRenderPassDesc
          (RenderPassDesc *__return_storage_ptr__,Uint32 NumRenderTargets,TEXTURE_FORMAT *RTVFormats
          ,TEXTURE_FORMAT DSVFormat,bool ReadOnlyDepth,Uint8 SampleCount,
          TEXTURE_FORMAT ShadingRateTexFormat,uint2 ShadingRateTileSize,
          array<Diligent::RenderPassAttachmentDesc,_10UL> *Attachments,
          array<Diligent::AttachmentReference,_10UL> *AttachmentReferences,SubpassDesc *SubpassDesc,
          ShadingRateAttachment *ShadingRateAttachment)

{
  RESOURCE_STATE RVar1;
  Char *Message;
  Uint32 *pUVar2;
  reference pvVar3;
  reference pvVar4;
  pointer pvVar5;
  char (*Args_1) [39];
  undefined7 in_register_00000081;
  reference local_d8;
  RenderPassAttachmentDesc *SRAttachment;
  RenderPassAttachmentDesc *ColorAttachment;
  AttachmentReference *ColorAttachmentRef;
  Uint32 rt;
  AttachmentReference *pColorAttachmentsReference;
  RenderPassAttachmentDesc *DepthAttachment;
  reference pvStack_68;
  RESOURCE_STATE DepthAttachmentState;
  AttachmentReference *pDepthAttachmentReference;
  Uint32 *AttachmentInd;
  undefined1 local_48 [8];
  string msg;
  Uint8 SampleCount_local;
  bool ReadOnlyDepth_local;
  TEXTURE_FORMAT DSVFormat_local;
  TEXTURE_FORMAT *RTVFormats_local;
  Uint32 UStack_10;
  Uint32 NumRenderTargets_local;
  uint2 ShadingRateTileSize_local;
  
  Args_1 = (char (*) [39])(CONCAT71(in_register_00000081,ReadOnlyDepth) & 0xffffff01);
  msg.field_2._M_local_buf[0xd] = (char)Args_1;
  msg.field_2._M_local_buf[0xc] = SampleCount;
  msg.field_2._14_2_ = DSVFormat;
  if (8 < NumRenderTargets) {
    FormatString<char[26],char[39]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumRenderTargets <= MAX_RENDER_TARGETS",Args_1);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetImplicitRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassCache.cpp"
               ,0x53);
    std::__cxx11::string::~string((string *)local_48);
  }
  RenderPassDesc::RenderPassDesc(__return_storage_ptr__);
  pUVar2 = &__return_storage_ptr__->AttachmentCount;
  pvStack_68 = (reference)0x0;
  if (msg.field_2._14_2_ != 0) {
    RVar1 = RESOURCE_STATE_DEPTH_WRITE;
    if ((msg.field_2._M_local_buf[0xd] & 1U) != 0) {
      RVar1 = RESOURCE_STATE_DEPTH_READ;
    }
    pvVar3 = std::array<Diligent::RenderPassAttachmentDesc,_10UL>::operator[]
                       (Attachments,(ulong)*pUVar2);
    pvVar3->Format = msg.field_2._14_2_;
    pvVar3->SampleCount = msg.field_2._M_local_buf[0xc];
    pvVar3->LoadOp = ATTACHMENT_LOAD_OP_LOAD;
    pvVar3->StoreOp = ATTACHMENT_STORE_OP_STORE;
    pvVar3->StencilLoadOp = ATTACHMENT_LOAD_OP_LOAD;
    pvVar3->StencilStoreOp = ATTACHMENT_STORE_OP_STORE;
    pvVar3->InitialState = RVar1;
    pvVar3->FinalState = RVar1;
    pvStack_68 = std::array<Diligent::AttachmentReference,_10UL>::operator[]
                           (AttachmentReferences,(ulong)*pUVar2);
    pvStack_68->AttachmentIndex = *pUVar2;
    pvStack_68->State = RVar1;
    *pUVar2 = *pUVar2 + 1;
  }
  if (NumRenderTargets == 0) {
    local_d8 = (reference)0x0;
  }
  else {
    local_d8 = std::array<Diligent::AttachmentReference,_10UL>::operator[]
                         (AttachmentReferences,(ulong)*pUVar2);
  }
  for (ColorAttachmentRef._4_4_ = 0; ColorAttachmentRef._4_4_ < NumRenderTargets;
      ColorAttachmentRef._4_4_ = ColorAttachmentRef._4_4_ + 1) {
    pvVar4 = local_d8 + ColorAttachmentRef._4_4_;
    if (RTVFormats[ColorAttachmentRef._4_4_] == TEX_FORMAT_UNKNOWN) {
      pvVar4->AttachmentIndex = 0xffffffff;
    }
    else {
      pvVar3 = std::array<Diligent::RenderPassAttachmentDesc,_10UL>::operator[]
                         (Attachments,(ulong)*pUVar2);
      pvVar3->Format = RTVFormats[ColorAttachmentRef._4_4_];
      pvVar3->SampleCount = msg.field_2._M_local_buf[0xc];
      pvVar3->LoadOp = ATTACHMENT_LOAD_OP_LOAD;
      pvVar3->StoreOp = ATTACHMENT_STORE_OP_STORE;
      pvVar3->StencilLoadOp = ATTACHMENT_LOAD_OP_DISCARD;
      pvVar3->StencilStoreOp = ATTACHMENT_STORE_OP_DISCARD;
      pvVar3->InitialState = RESOURCE_STATE_RENDER_TARGET;
      pvVar3->FinalState = RESOURCE_STATE_RENDER_TARGET;
      pvVar4->AttachmentIndex = *pUVar2;
      pvVar4->State = RESOURCE_STATE_RENDER_TARGET;
      *pUVar2 = *pUVar2 + 1;
    }
  }
  if (ShadingRateTexFormat != TEX_FORMAT_UNKNOWN) {
    pvVar3 = std::array<Diligent::RenderPassAttachmentDesc,_10UL>::operator[]
                       (Attachments,(ulong)*pUVar2);
    pvVar3->Format = ShadingRateTexFormat;
    pvVar3->SampleCount = '\x01';
    pvVar3->LoadOp = ATTACHMENT_LOAD_OP_LOAD;
    pvVar3->StoreOp = ATTACHMENT_STORE_OP_DISCARD;
    pvVar3->StencilLoadOp = ATTACHMENT_LOAD_OP_DISCARD;
    pvVar3->StencilStoreOp = ATTACHMENT_STORE_OP_DISCARD;
    pvVar3->InitialState = RESOURCE_STATE_MAX_BIT;
    pvVar3->FinalState = RESOURCE_STATE_MAX_BIT;
    (ShadingRateAttachment->Attachment).AttachmentIndex = *pUVar2;
    (ShadingRateAttachment->Attachment).State = RESOURCE_STATE_MAX_BIT;
    UStack_10 = ShadingRateTileSize.field_0._0_4_;
    ShadingRateAttachment->TileSize[0] = UStack_10;
    NumRenderTargets_local = ShadingRateTileSize.field_0._4_4_;
    ShadingRateAttachment->TileSize[1] = NumRenderTargets_local;
    SubpassDesc->pShadingRateAttachment = ShadingRateAttachment;
    *pUVar2 = *pUVar2 + 1;
  }
  pvVar5 = std::array<Diligent::RenderPassAttachmentDesc,_10UL>::data(Attachments);
  __return_storage_ptr__->pAttachments = pvVar5;
  __return_storage_ptr__->SubpassCount = 1;
  __return_storage_ptr__->pSubpasses = SubpassDesc;
  __return_storage_ptr__->DependencyCount = 0;
  __return_storage_ptr__->pDependencies = (SubpassDependencyDesc *)0x0;
  SubpassDesc->InputAttachmentCount = 0;
  SubpassDesc->pInputAttachments = (AttachmentReference *)0x0;
  SubpassDesc->RenderTargetAttachmentCount = NumRenderTargets;
  SubpassDesc->pRenderTargetAttachments = local_d8;
  SubpassDesc->pResolveAttachments = (AttachmentReference *)0x0;
  SubpassDesc->pDepthStencilAttachment = pvStack_68;
  SubpassDesc->PreserveAttachmentCount = 0;
  SubpassDesc->pPreserveAttachments = (Uint32 *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static RenderPassDesc GetImplicitRenderPassDesc(
    Uint32                                                        NumRenderTargets,
    const TEXTURE_FORMAT                                          RTVFormats[],
    TEXTURE_FORMAT                                                DSVFormat,
    bool                                                          ReadOnlyDepth,
    Uint8                                                         SampleCount,
    TEXTURE_FORMAT                                                ShadingRateTexFormat,
    uint2                                                         ShadingRateTileSize,
    std::array<RenderPassAttachmentDesc, MAX_RENDER_TARGETS + 2>& Attachments,
    std::array<AttachmentReference, MAX_RENDER_TARGETS + 2>&      AttachmentReferences,
    SubpassDesc&                                                  SubpassDesc,
    ShadingRateAttachment&                                        ShadingRateAttachment)
{
    VERIFY_EXPR(NumRenderTargets <= MAX_RENDER_TARGETS);

    RenderPassDesc RPDesc;

    Uint32& AttachmentInd{RPDesc.AttachmentCount};

    AttachmentReference* pDepthAttachmentReference = nullptr;
    if (DSVFormat != TEX_FORMAT_UNKNOWN)
    {
        const RESOURCE_STATE DepthAttachmentState = ReadOnlyDepth ? RESOURCE_STATE_DEPTH_READ : RESOURCE_STATE_DEPTH_WRITE;

        RenderPassAttachmentDesc& DepthAttachment = Attachments[AttachmentInd];

        DepthAttachment.Format      = DSVFormat;
        DepthAttachment.SampleCount = SampleCount;
        DepthAttachment.LoadOp      = ATTACHMENT_LOAD_OP_LOAD; // previous contents of the image within the render area
                                                               // will be preserved. For attachments with a depth/stencil format,
                                                               // this uses the access type VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT.
        DepthAttachment.StoreOp = ATTACHMENT_STORE_OP_STORE;   // the contents generated during the render pass and within the render
                                                               // area are written to memory. For attachments with a depth/stencil format,
                                                               // this uses the access type VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT.
        DepthAttachment.StencilLoadOp  = ATTACHMENT_LOAD_OP_LOAD;
        DepthAttachment.StencilStoreOp = ATTACHMENT_STORE_OP_STORE;
        DepthAttachment.InitialState   = DepthAttachmentState;
        DepthAttachment.FinalState     = DepthAttachmentState;

        pDepthAttachmentReference                  = &AttachmentReferences[AttachmentInd];
        pDepthAttachmentReference->AttachmentIndex = AttachmentInd;
        pDepthAttachmentReference->State           = DepthAttachmentState;

        ++AttachmentInd;
    }

    AttachmentReference* pColorAttachmentsReference = NumRenderTargets > 0 ? &AttachmentReferences[AttachmentInd] : nullptr;
    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
    {
        AttachmentReference& ColorAttachmentRef = pColorAttachmentsReference[rt];

        if (RTVFormats[rt] == TEX_FORMAT_UNKNOWN)
        {
            ColorAttachmentRef.AttachmentIndex = ATTACHMENT_UNUSED;
            continue;
        }

        RenderPassAttachmentDesc& ColorAttachment = Attachments[AttachmentInd];

        ColorAttachment.Format      = RTVFormats[rt];
        ColorAttachment.SampleCount = SampleCount;
        ColorAttachment.LoadOp      = ATTACHMENT_LOAD_OP_LOAD; // previous contents of the image within the render area
                                                               // will be preserved. For attachments with a depth/stencil format,
                                                               // this uses the access type VK_ACCESS_COLOR_ATTACHMENT_READ_BIT.
        ColorAttachment.StoreOp = ATTACHMENT_STORE_OP_STORE;   // the contents generated during the render pass and within the render
                                                               // area are written to memory. For attachments with a color format,
                                                               // this uses the access type VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT.
        ColorAttachment.StencilLoadOp  = ATTACHMENT_LOAD_OP_DISCARD;
        ColorAttachment.StencilStoreOp = ATTACHMENT_STORE_OP_DISCARD;
        ColorAttachment.InitialState   = RESOURCE_STATE_RENDER_TARGET;
        ColorAttachment.FinalState     = RESOURCE_STATE_RENDER_TARGET;

        ColorAttachmentRef.AttachmentIndex = AttachmentInd;
        ColorAttachmentRef.State           = RESOURCE_STATE_RENDER_TARGET;

        ++AttachmentInd;
    }

    if (ShadingRateTexFormat != TEX_FORMAT_UNKNOWN)
    {
        RenderPassAttachmentDesc& SRAttachment = Attachments[AttachmentInd];

        SRAttachment.Format         = ShadingRateTexFormat;
        SRAttachment.SampleCount    = 1;
        SRAttachment.LoadOp         = ATTACHMENT_LOAD_OP_LOAD;
        SRAttachment.StoreOp        = ATTACHMENT_STORE_OP_DISCARD;
        SRAttachment.StencilLoadOp  = ATTACHMENT_LOAD_OP_DISCARD;
        SRAttachment.StencilStoreOp = ATTACHMENT_STORE_OP_DISCARD;
        SRAttachment.InitialState   = RESOURCE_STATE_SHADING_RATE;
        SRAttachment.FinalState     = RESOURCE_STATE_SHADING_RATE;

        ShadingRateAttachment.Attachment.AttachmentIndex = AttachmentInd;
        ShadingRateAttachment.Attachment.State           = RESOURCE_STATE_SHADING_RATE;

        ShadingRateAttachment.TileSize[0] = ShadingRateTileSize.x;
        ShadingRateAttachment.TileSize[1] = ShadingRateTileSize.y;

        SubpassDesc.pShadingRateAttachment = &ShadingRateAttachment;

        ++AttachmentInd;
    }

    RPDesc.pAttachments    = Attachments.data();
    RPDesc.SubpassCount    = 1;
    RPDesc.pSubpasses      = &SubpassDesc;
    RPDesc.DependencyCount = 0;       // the number of dependencies between pairs of subpasses, or zero indicating no dependencies.
    RPDesc.pDependencies   = nullptr; // an array of dependencyCount number of VkSubpassDependency structures describing
                                      // dependencies between pairs of subpasses, or NULL if dependencyCount is zero.


    SubpassDesc.InputAttachmentCount        = 0;
    SubpassDesc.pInputAttachments           = nullptr;
    SubpassDesc.RenderTargetAttachmentCount = NumRenderTargets;
    SubpassDesc.pRenderTargetAttachments    = pColorAttachmentsReference;
    SubpassDesc.pResolveAttachments         = nullptr;
    SubpassDesc.pDepthStencilAttachment     = pDepthAttachmentReference;
    SubpassDesc.PreserveAttachmentCount     = 0;
    SubpassDesc.pPreserveAttachments        = nullptr;

    return RPDesc;
}